

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

int png_safe_execute(png_imagep image,_func_int_png_voidp *function,png_voidp arg)

{
  int iVar1;
  undefined1 local_f8 [4];
  int result;
  jmp_buf safe_jmpbuf;
  png_voidp saved_error_buf;
  png_voidp arg_local;
  _func_int_png_voidp *function_local;
  png_imagep image_local;
  
  safe_jmpbuf[0].__saved_mask.__val[0xf] = (unsigned_long)image->opaque->error_buf;
  iVar1 = _setjmp((__jmp_buf_tag *)local_f8);
  if (iVar1 == 0) {
    image->opaque->error_buf = local_f8;
    iVar1 = (*function)(arg);
    image->opaque->error_buf = (png_voidp)safe_jmpbuf[0].__saved_mask.__val[0xf];
    if (iVar1 != 0) {
      return 1;
    }
  }
  image->opaque->error_buf = (png_voidp)safe_jmpbuf[0].__saved_mask.__val[0xf];
  if (safe_jmpbuf[0].__saved_mask.__val[0xf] == 0) {
    png_image_free(image);
  }
  return 0;
}

Assistant:

int /* PRIVATE */
png_safe_execute(png_imagep image, int (*function)(png_voidp), png_voidp arg)
{
   const png_voidp saved_error_buf = image->opaque->error_buf;
   jmp_buf safe_jmpbuf;

   /* Safely execute function(arg), with png_error returning back here. */
   if (setjmp(safe_jmpbuf) == 0)
   {
      int result;

      image->opaque->error_buf = safe_jmpbuf;
      result = function(arg);
      image->opaque->error_buf = saved_error_buf;

      if (result)
         return 1; /* success */
   }

   /* The function failed either because of a caught png_error and a regular
    * return of false above or because of an uncaught png_error from the
    * function itself.  Ensure that the error_buf is always set back to the
    * value saved above:
    */
   image->opaque->error_buf = saved_error_buf;

   /* On the final false return, when about to return control to the caller, the
    * image is freed (png_image_free does this check but it is duplicated here
    * for clarity:
    */
   if (saved_error_buf == NULL)
      png_image_free(image);

   return 0; /* failure */
}